

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.hh
# Opt level: O3

void __thiscall kratos::Var::~Var(Var *this)

{
  _Atomic_word *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  pointer puVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  int iVar6;
  
  (this->super_IRNode)._vptr_IRNode = (_func_int **)&PTR_accept_002a4a98;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<kratos::VarExtend>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<kratos::VarExtend>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->extended_)._M_h);
  std::
  _Rb_tree<std::shared_ptr<kratos::VarCasted>,_std::shared_ptr<kratos::VarCasted>,_std::_Identity<std::shared_ptr<kratos::VarCasted>_>,_std::less<std::shared_ptr<kratos::VarCasted>_>,_std::allocator<std::shared_ptr<kratos::VarCasted>_>_>
  ::~_Rb_tree(&(this->casted_)._M_t);
  pcVar3 = (this->after_var_str_)._M_dataplus._M_p;
  paVar2 = &(this->after_var_str_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar2) {
    operator_delete(pcVar3,paVar2->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->before_var_str_)._M_dataplus._M_p;
  paVar2 = &(this->before_var_str_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar2) {
    operator_delete(pcVar3,paVar2->_M_allocated_capacity + 1);
  }
  std::
  vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>::
  ~vector(&this->slices_);
  std::
  vector<std::shared_ptr<kratos::VarConcat>,_std::allocator<std::shared_ptr<kratos::VarConcat>_>_>::
  ~vector(&this->concat_vars_);
  std::
  _Hashtable<std::shared_ptr<kratos::AssignStmt>,_std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&(this->sources_)._M_h);
  std::
  _Hashtable<std::shared_ptr<kratos::AssignStmt>,_std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&(this->sinks_)._M_h);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_kratos::Var_*>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->size_param_)._M_h);
  puVar4 = (this->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar4 != (pointer)0x0) {
    operator_delete(puVar4,(long)(this->size_).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar4);
  }
  pcVar3 = (this->name)._M_dataplus._M_p;
  paVar2 = &(this->name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar2) {
    operator_delete(pcVar3,paVar2->_M_allocated_capacity + 1);
  }
  IRNode::~IRNode(&this->super_IRNode);
  p_Var5 = (this->super_enable_shared_from_this<kratos::Var>)._M_weak_this.
           super___weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var5->_M_weak_count;
      iVar6 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar6 = p_Var5->_M_weak_count;
      p_Var5->_M_weak_count = iVar6 + -1;
    }
    if (iVar6 == 1) {
      (*p_Var5->_vptr__Sp_counted_base[3])();
      return;
    }
  }
  return;
}

Assistant:

~Var() override = default;